

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

string * tinyformat::format<std::__cxx11::string,char_const*>
                   (string *fmt,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   char **args_1)

{
  string *in_RDI;
  long in_FS_OFFSET;
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  char *in_stack_fffffffffffffe50;
  ostream *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180 [11];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  args_00 = local_180;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)args_00);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
            (in_stack_fffffffffffffe28);
  format<std::__cxx11::string,char_const*>
            (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,args_00,(char **)in_RDI);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_180);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const std::string &fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt.c_str(), args...);
    return oss.str();
}